

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixRotate(Matrix *__return_storage_ptr__,Vector3 axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float t;
  float cosres;
  float sinres;
  float inverseLength;
  float lengthSquared;
  float z;
  float y;
  float x;
  float angle_local;
  float local_14;
  float fStack_10;
  Vector3 axis_local;
  
  inverseLength = axis.z;
  memset(__return_storage_ptr__,0,0x40);
  local_14 = axis.x;
  z = local_14;
  fStack_10 = axis.y;
  lengthSquared = fStack_10;
  fVar1 = inverseLength * inverseLength + local_14 * local_14 + fStack_10 * fStack_10;
  if (((fVar1 != 1.0) || (NAN(fVar1))) && ((fVar1 != 0.0 || (NAN(fVar1))))) {
    fVar1 = sqrtf(fVar1);
    fVar1 = 1.0 / fVar1;
    z = fVar1 * local_14;
    lengthSquared = fVar1 * fStack_10;
    inverseLength = fVar1 * inverseLength;
  }
  fVar1 = sinf(angle);
  fVar2 = cosf(angle);
  fVar3 = 1.0 - fVar2;
  __return_storage_ptr__->m0 = z * z * fVar3 + fVar2;
  __return_storage_ptr__->m1 = lengthSquared * z * fVar3 + inverseLength * fVar1;
  __return_storage_ptr__->m2 = inverseLength * z * fVar3 + -(lengthSquared * fVar1);
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m4 = z * lengthSquared * fVar3 + -(inverseLength * fVar1);
  __return_storage_ptr__->m5 = lengthSquared * lengthSquared * fVar3 + fVar2;
  __return_storage_ptr__->m6 = inverseLength * lengthSquared * fVar3 + z * fVar1;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m8 = z * inverseLength * fVar3 + lengthSquared * fVar1;
  __return_storage_ptr__->m9 = lengthSquared * inverseLength * fVar3 + -(z * fVar1);
  __return_storage_ptr__->m10 = inverseLength * inverseLength * fVar3 + fVar2;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotate(Vector3 axis, float angle)
{
    Matrix result = { 0 };

    float x = axis.x, y = axis.y, z = axis.z;

    float lengthSquared = x*x + y*y + z*z;

    if ((lengthSquared != 1.0f) && (lengthSquared != 0.0f))
    {
        float inverseLength = 1.0f/sqrtf(lengthSquared);
        x *= inverseLength;
        y *= inverseLength;
        z *= inverseLength;
    }

    float sinres = sinf(angle);
    float cosres = cosf(angle);
    float t = 1.0f - cosres;

    result.m0  = x*x*t + cosres;
    result.m1  = y*x*t + z*sinres;
    result.m2  = z*x*t - y*sinres;
    result.m3  = 0.0f;

    result.m4  = x*y*t - z*sinres;
    result.m5  = y*y*t + cosres;
    result.m6  = z*y*t + x*sinres;
    result.m7  = 0.0f;

    result.m8  = x*z*t + y*sinres;
    result.m9  = y*z*t - x*sinres;
    result.m10 = z*z*t + cosres;
    result.m11 = 0.0f;

    result.m12 = 0.0f;
    result.m13 = 0.0f;
    result.m14 = 0.0f;
    result.m15 = 1.0f;

    return result;
}